

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Table.cxx
# Opt level: O1

int __thiscall Fl_Table::handle(Fl_Table *this,int event)

{
  void *arg;
  uint uVar1;
  int iVar2;
  TableContext TVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int C;
  int R;
  ResizeFlag resizeflag;
  int local_44;
  int local_40;
  int local_3c;
  ResizeFlag local_38;
  int local_34;
  
  iVar2 = Fl_Group::handle(&this->super_Fl_Group,event);
  TVar3 = cursor2rowcol(this,&local_40,&local_44,&local_38);
  if (iVar2 != 0) {
    iVar4 = Fl::event_inside((Fl_Widget *)this->hscrollbar);
    if (iVar4 != 0) {
      return 1;
    }
    iVar4 = Fl::event_inside((Fl_Widget *)this->vscrollbar);
    if (iVar4 != 0) {
      return 1;
    }
    if ((((TVar3 != CONTEXT_ROW_HEADER) && (TVar3 != CONTEXT_COL_HEADER)) &&
        ((Fl_Table *)Fl::focus_ != this)) &&
       (iVar4 = Fl_Widget::contains((Fl_Widget *)this,Fl::focus_), iVar4 != 0)) {
      return 1;
    }
  }
  iVar6 = Fl::e_keysym;
  iVar5 = Fl::e_y;
  iVar4 = Fl::e_x;
  switch(event) {
  case 1:
    local_3c = Fl::e_y;
    local_34 = Fl::e_x;
    if (Fl::e_keysym == 0xfee9 && Fl::e_clicks == 0) {
      if ((Fl_Table *)Fl::focus_ == this) {
        Fl_Widget::take_focus((Fl_Widget *)this);
        this->_callback_context = CONTEXT_TABLE;
        this->_callback_row = -1;
        this->_callback_col = -1;
        Fl_Widget::do_callback
                  ((Fl_Widget *)this,(Fl_Widget *)this,
                   (this->super_Fl_Group).super_Fl_Widget.user_data_);
        iVar2 = 1;
      }
      iVar5 = local_40;
      iVar4 = local_44;
      damage_zone(this,this->current_row,this->current_col,this->select_row,this->select_col,
                  local_40,local_44);
      if (TVar3 == CONTEXT_CELL) {
        this->select_row = iVar5;
        this->current_row = iVar5;
        this->select_col = iVar4;
        this->current_col = iVar4;
        this->_selecting = 0x10;
      }
      else if (local_38 == RESIZE_NONE) {
        this->current_row = -1;
        this->current_col = -1;
        this->select_row = -1;
        this->select_col = -1;
      }
    }
    if (local_38 == RESIZE_NONE &&
        (this->super_Fl_Group).super_Fl_Widget.callback_ != (Fl_Callback *)0x0) {
      this->_callback_context = TVar3;
      this->_callback_row = local_40;
      this->_callback_col = local_44;
      Fl_Widget::do_callback
                ((Fl_Widget *)this,(Fl_Widget *)this,
                 (this->super_Fl_Group).super_Fl_Widget.user_data_);
    }
    switch(TVar3 << 0x1e | TVar3 >> 2) {
    case CONTEXT_NONE:
      if ((iVar6 != 0xfee9) ||
         (this->_row_header_w + (this->super_Fl_Group).super_Fl_Widget.x_ <= local_34))
      goto LAB_001cccc5;
      local_44 = this->_cols + -1;
      this->select_col = local_44;
      this->current_row = 0;
      this->current_col = 0;
      iVar2 = this->_rows + -1;
      this->select_row = iVar2;
      iVar4 = 0;
LAB_001ccc51:
      iVar5 = 0;
LAB_001cccb7:
      damage_zone(this,iVar4,iVar5,iVar2,local_44,0,0);
      break;
    case CONTEXT_STARTPAGE:
      if (iVar6 != 0xfee9) goto LAB_001cccc5;
      if (local_38 == RESIZE_NONE) {
        if (((Fl_Table *)Fl::focus_ != this) &&
           (iVar2 = Fl_Widget::contains((Fl_Widget *)this,Fl::focus_), iVar2 != 0)) {
          return 0;
        }
        this->select_row = local_40;
        this->current_row = local_40;
        this->current_col = 0;
        local_44 = this->_cols + -1;
        this->select_col = local_44;
        this->_selecting = 4;
        iVar2 = local_40;
        iVar4 = local_40;
        goto LAB_001ccc51;
      }
      this->_resizing_row = local_40 + -1 + (uint)((local_38 & RESIZE_ROW_ABOVE) == RESIZE_NONE);
      this->_resizing_col = -1;
      this->_dragging_y = local_3c;
      break;
    case CONTEXT_ENDPAGE:
      if (iVar6 != 0xfee9) goto LAB_001cccc5;
      if (local_38 == RESIZE_NONE) {
        if (((Fl_Table *)Fl::focus_ != this) &&
           (iVar2 = Fl_Widget::contains((Fl_Widget *)this,Fl::focus_), iVar2 != 0)) {
          return 0;
        }
        this->select_col = local_44;
        this->current_col = local_44;
        this->current_row = 0;
        iVar2 = this->_rows + -1;
        this->select_row = iVar2;
        this->_selecting = 8;
        iVar4 = 0;
        iVar5 = local_44;
        goto LAB_001cccb7;
      }
      this->_resizing_col = local_44 - (local_38 & RESIZE_COL_LEFT);
      this->_resizing_row = -1;
      this->_dragging_x = local_34;
      break;
    default:
      iVar2 = 0;
      goto LAB_001cccc5;
    case CONTEXT_ROW_HEADER:
      break;
    }
    iVar2 = 1;
LAB_001cccc5:
    this->_last_row = local_40;
    return iVar2;
  case 2:
    if (this->_auto_drag != 0) {
      Fl::remove_timeout(_auto_drag_cb2,this);
      this->_auto_drag = 0;
    }
    uVar1 = TVar3 - CONTEXT_ROW_HEADER >> 2;
    if ((((((TVar3 << 0x1e | uVar1) < 8) && ((0x8bU >> (uVar1 & 0x1f) & 1) != 0)) &&
         ((this->_resizing_col == -1 &&
          ((this->_resizing_row == -1 &&
           ((this->super_Fl_Group).super_Fl_Widget.callback_ != (Fl_Callback *)0x0)))))) &&
        (((this->super_Fl_Group).super_Fl_Widget.when_ & 4) != 0)) && (this->_last_row == local_40))
    {
      this->_callback_context = TVar3;
      this->_callback_row = local_40;
      this->_callback_col = local_44;
      Fl_Widget::do_callback
                ((Fl_Widget *)this,(Fl_Widget *)this,
                 (this->super_Fl_Group).super_Fl_Widget.user_data_);
    }
    if (iVar6 != 0xfee9) {
      return iVar2;
    }
    if (this->_last_cursor != FL_CURSOR_DEFAULT) {
      fl_cursor(FL_CURSOR_DEFAULT,0x38,0xff);
      this->_last_cursor = FL_CURSOR_DEFAULT;
    }
    this->_resizing_col = -1;
    this->_resizing_row = -1;
    goto LAB_001ccb68;
  case 3:
    iVar4 = 1;
    if (iVar2 == 0) {
      Fl_Widget::take_focus((Fl_Widget *)this);
    }
    goto LAB_001cc678;
  case 4:
    iVar4 = iVar2;
LAB_001cc678:
    iVar2 = 1;
    if (local_38 == RESIZE_NONE) {
      iVar2 = iVar4;
    }
    if (event != 4) {
      return iVar2;
    }
    if (this->_auto_drag != 0) {
      Fl::remove_timeout(_auto_drag_cb2,this);
      this->_auto_drag = 0;
    }
    if (this->_last_cursor == FL_CURSOR_DEFAULT) {
      return iVar2;
    }
LAB_001cc6bf:
    fl_cursor(FL_CURSOR_DEFAULT,0x38,0xff);
    this->_last_cursor = FL_CURSOR_DEFAULT;
    return iVar2;
  case 5:
    local_3c = Fl::e_y;
    if (this->_auto_drag == 1) {
      return 1;
    }
    iVar6 = this->_resizing_col;
    if ((long)iVar6 < 0) {
      iVar6 = this->_resizing_row;
      if ((long)iVar6 < 0) {
        if (Fl::e_keysym == 0xfee9) {
          iVar5 = this->_selecting;
          if (TVar3 == CONTEXT_CELL && iVar5 == 0x10) {
            if (Fl::e_clicks != 0) {
              return iVar2;
            }
            if ((this->select_row != local_40) || (this->select_col != local_44)) {
              damage_zone(this,this->current_row,this->current_col,this->select_row,this->select_col
                          ,local_40,local_44);
            }
            this->select_row = local_40;
            this->select_col = local_44;
          }
          else if ((TVar3 & (CONTEXT_CELL|CONTEXT_COL_HEADER|CONTEXT_ROW_HEADER)) == CONTEXT_NONE ||
                   iVar5 != 4) {
            if (iVar5 != 8 ||
                (TVar3 & (CONTEXT_CELL|CONTEXT_COL_HEADER|CONTEXT_ROW_HEADER)) == CONTEXT_NONE)
            goto LAB_001ccd80;
            if (this->select_col != local_44) {
              damage_zone(this,this->current_row,this->current_col,this->select_row,this->select_col
                          ,local_40,local_44);
            }
            this->select_col = local_44;
          }
          else {
            if (this->select_row != local_40) {
              damage_zone(this,this->current_row,this->current_col,this->select_row,this->select_col
                          ,local_40,local_44);
            }
            this->select_row = local_40;
          }
          iVar2 = 1;
        }
        goto LAB_001ccd80;
      }
      iVar2 = 0;
      if (iVar6 < (int)(this->_rowheights)._size) {
        iVar2 = (this->_rowheights).arr[iVar6];
      }
      iVar2 = (Fl::e_y - this->_dragging_y) + iVar2;
      if (iVar2 <= this->_row_resize_min) {
        iVar2 = this->_row_resize_min;
      }
      row_height(this,iVar6,iVar2);
      this->_dragging_y = iVar5;
      table_resized(this);
      Fl_Widget::redraw((Fl_Widget *)this);
      if (this->_last_cursor != FL_CURSOR_NS) {
        fl_cursor(FL_CURSOR_NS,0x38,0xff);
        this->_last_cursor = FL_CURSOR_NS;
      }
    }
    else {
      iVar2 = 0;
      if (iVar6 < (int)(this->_colwidths)._size) {
        iVar2 = (this->_colwidths).arr[iVar6];
      }
      iVar2 = (Fl::e_x - this->_dragging_x) + iVar2;
      if (iVar2 <= this->_col_resize_min) {
        iVar2 = this->_col_resize_min;
      }
      col_width(this,iVar6,iVar2);
      this->_dragging_x = iVar4;
      table_resized(this);
      Fl_Widget::redraw((Fl_Widget *)this);
      if (this->_last_cursor != FL_CURSOR_WE) {
        fl_cursor(FL_CURSOR_WE,0x38,0xff);
        this->_last_cursor = FL_CURSOR_WE;
      }
    }
    iVar2 = 1;
    if (((this->super_Fl_Group).super_Fl_Widget.callback_ != (Fl_Callback *)0x0) &&
       (((this->super_Fl_Group).super_Fl_Widget.when_ & 1) != 0)) {
      this->_callback_context = CONTEXT_RC_RESIZE;
      this->_callback_row = local_40;
      this->_callback_col = local_44;
      Fl_Widget::do_callback
                ((Fl_Widget *)this,(Fl_Widget *)this,
                 (this->super_Fl_Group).super_Fl_Widget.user_data_);
    }
LAB_001ccd80:
    if (-1 < this->_resizing_row) {
      return iVar2;
    }
    if (-1 < this->_resizing_col) {
      return iVar2;
    }
    if (this->_auto_drag != 0) {
      return iVar2;
    }
    iVar5 = (this->super_Fl_Group).super_Fl_Widget.x_;
    if ((((iVar4 <= (this->super_Fl_Group).super_Fl_Widget.w_ + iVar5 + -0x14) &&
         (iVar5 + this->_row_header_w <= iVar4)) &&
        (iVar4 = (this->super_Fl_Group).super_Fl_Widget.y_,
        local_3c <= (this->super_Fl_Group).super_Fl_Widget.h_ + iVar4 + -0x14)) &&
       (iVar4 + this->_col_header_h <= local_3c)) {
      return iVar2;
    }
    this->_auto_drag = 1;
    Fl::add_timeout(0.3,_auto_drag_cb2,this);
    return iVar2;
  case 6:
    Fl::focus((Fl_Widget *)this);
  case 7:
    if (this->_auto_drag != 0) {
      Fl::remove_timeout(_auto_drag_cb2,this);
      this->_auto_drag = 0;
      return 1;
    }
    return 1;
  case 8:
    break;
  default:
    if (this->_last_cursor != FL_CURSOR_DEFAULT) {
      fl_cursor(FL_CURSOR_DEFAULT,0x38,0xff);
      this->_last_cursor = FL_CURSOR_DEFAULT;
      return iVar2;
    }
    return iVar2;
  case 0xb:
    if (local_38 != RESIZE_NONE && TVar3 == CONTEXT_COL_HEADER) {
      if (this->_last_cursor != FL_CURSOR_WE) {
        fl_cursor(FL_CURSOR_WE,0x38,0xff);
        this->_last_cursor = FL_CURSOR_WE;
        return 1;
      }
      return 1;
    }
    iVar2 = 1;
    if (TVar3 == CONTEXT_ROW_HEADER && local_38 != RESIZE_NONE) {
      if (this->_last_cursor != FL_CURSOR_NS) {
        fl_cursor(FL_CURSOR_NS,0x38,0xff);
        this->_last_cursor = FL_CURSOR_NS;
        return 1;
      }
      return 1;
    }
    if (this->_last_cursor == FL_CURSOR_DEFAULT) {
      return 1;
    }
    goto LAB_001cc6bf;
  }
  iVar2 = this->select_row;
  iVar4 = this->select_col;
  switch(Fl::e_keysym) {
  case 0xff50:
    iVar6 = 0;
    iVar5 = -1000000;
    break;
  case 0xff51:
    iVar6 = 0;
    iVar5 = -1;
    break;
  case 0xff52:
    iVar6 = -1;
    goto LAB_001ccacc;
  case 0xff53:
    iVar6 = 0;
    iVar5 = 1;
    break;
  case 0xff54:
    iVar6 = 1;
    goto LAB_001ccacc;
  case 0xff55:
    iVar6 = (this->toprow - this->botrow) + 1;
    goto LAB_001ccacc;
  case 0xff56:
    iVar6 = ~this->toprow + this->botrow;
LAB_001ccacc:
    iVar5 = 0;
    break;
  case 0xff57:
    iVar6 = 0;
    iVar5 = 1000000;
    break;
  default:
    iVar5 = 0;
    goto LAB_001ccada;
  }
  iVar5 = move_cursor(this,iVar6,iVar5,1);
LAB_001ccada:
  if ((iVar5 != 0) && ((Fl_Table *)Fl::focus_ != this)) {
    this->_callback_context = CONTEXT_TABLE;
    this->_callback_row = -1;
    this->_callback_col = -1;
    Fl_Widget::do_callback
              ((Fl_Widget *)this,(Fl_Widget *)this,(this->super_Fl_Group).super_Fl_Widget.user_data_
              );
    Fl_Widget::take_focus((Fl_Widget *)this);
  }
  if (((this->super_Fl_Group).super_Fl_Widget.callback_ != (Fl_Callback *)0x0) &&
     (((iVar5 == 0 && (((this->super_Fl_Group).super_Fl_Widget.when_ & 2) != 0)) ||
      ((iVar2 != this->select_row || (iVar4 != this->select_col)))))) {
    arg = (this->super_Fl_Group).super_Fl_Widget.user_data_;
    this->_callback_context = CONTEXT_CELL;
    this->_callback_row = this->select_row;
    this->_callback_col = this->select_col;
    Fl_Widget::do_callback((Fl_Widget *)this,(Fl_Widget *)this,arg);
LAB_001ccb68:
    iVar5 = 1;
  }
  return iVar5;
}

Assistant:

int Fl_Table::handle(int event) {
  PRINTEVENT;
  int ret = Fl_Group::handle(event);	// let FLTK group handle events first
  // Which row/column are we over?
  int R, C;  				// row/column being worked on
  ResizeFlag resizeflag;		// which resizing area are we over? (0=none)
  TableContext context = cursor2rowcol(R, C, resizeflag);
  if (ret) {
    if (Fl::event_inside(hscrollbar) || Fl::event_inside(vscrollbar)) return 1;
    if ( context != CONTEXT_ROW_HEADER &&		// mouse not in row header (STR#2742)
         context != CONTEXT_COL_HEADER &&		// mouse not in col header (STR#2742)
         Fl::focus() != this && 			// we don't have focus?
         contains(Fl::focus())) {			// focus is a child?
      return 1;
    }
  }
  // Make snapshots of realtime event states *before* we service user's cb,
  // which may do things like post popup menus that return with unexpected button states.
  int _event_button = Fl::event_button();
  int _event_clicks = Fl::event_clicks();
  int _event_x      = Fl::event_x();
  int _event_y      = Fl::event_y();
  int _event_key    = Fl::event_key();
#if FLTK_ABI_VERSION >= 10303
  int _event_state  = Fl::event_state();
#endif
  Fl_Widget *_focus = Fl::focus();
  switch ( event ) {
    case FL_PUSH:
      // Single left-click on table? do user's callback with CONTEXT_TABLE
      if (_event_button == 1 && !_event_clicks) {
        if (_focus == this) {
          take_focus();
          do_callback(CONTEXT_TABLE, -1, -1);
          ret = 1;
        }
        damage_zone(current_row, current_col, select_row, select_col, R, C);
        if (context == CONTEXT_CELL) {
          current_row = select_row = R;
          current_col = select_col = C;
          _selecting = CONTEXT_CELL;
        } else {
	  // Clear selection if not resizing row/col
	  if ( !resizeflag ) {
            current_row = select_row = -1;
            current_col = select_col = -1;
	  }
        }
      }
      // A click on table with user's callback defined?
      //     Need this for eg. right click to pop up a menu
      //
      if ( Fl_Widget::callback() &&		// callback defined?
          resizeflag == RESIZE_NONE ) {		// not resizing?
        do_callback(context, R, C);		// do callback with context (cell, header, etc)
      }
      // Handle selection if handling a left-click
      //    Use snapshot of _event_button we made before servicing user's cb's
      //    to avoid checking realtime state of buttons which may have changed
      //    during the user's callbacks.
      //
      switch ( context ) {
        case CONTEXT_CELL:
          // FL_PUSH on a cell?
          ret = 1;				// express interest in FL_RELEASE
          break;
          
        case CONTEXT_NONE:
          // FL_PUSH on table corner?
          if ( _event_button == 1 && _event_x < x() + row_header_width()) {
            current_col = 0;
            select_col = cols() - 1;
            current_row = 0;
            select_row = rows() - 1;				
            damage_zone(current_row, current_col, select_row, select_col);
            ret = 1;
          }
          break;
          
        case CONTEXT_COL_HEADER:
          // FL_PUSH on a column header?
          if ( _event_button == 1) {
            // Resizing? Handle it
            if ( resizeflag ) {
              // Start resize if left click on column border.
              //    "ret=1" ensures we get drag events from now on.
              //    (C-1) is used if mouse is over the left hand side 
              //    of cell, so we resize the next column on the left.
              //
              _resizing_col = ( resizeflag & RESIZE_COL_LEFT ) ? C-1 : C; 
              _resizing_row = -1;
              _dragging_x = _event_x;
              ret = 1;
            } else {
              // Not resizing? Select the column
	      if ( Fl::focus() != this && contains(Fl::focus()) ) return 0;	// STR #3018 - item 1
              current_col = select_col = C;
              current_row = 0;
              select_row = rows() - 1;
              _selecting = CONTEXT_COL_HEADER;
              damage_zone(current_row, current_col, select_row, select_col);
              ret = 1;
            }
          }
          break;
          
        case CONTEXT_ROW_HEADER:
          // FL_PUSH on a row header?
          if ( _event_button == 1 ) {
            // Resizing? Handle it
            if ( resizeflag ) {
              // Start resize if left mouse clicked on row border.
              //    "ret = 1" ensures we get drag events from now on.
              //    (R-1) is used if mouse is over the top of the cell,
              //    so that we resize the row above.
              //
              _resizing_row = ( resizeflag & RESIZE_ROW_ABOVE ) ? R-1 : R; 
              _resizing_col = -1;
              _dragging_y = _event_y; 
              ret = 1;
            } else {
              // Not resizing? Select the row
	      if ( Fl::focus() != this && contains(Fl::focus()) ) return 0;	// STR #3018 - item 1
              current_row = select_row = R;
              current_col = 0;
              select_col = cols() - 1;
              _selecting = CONTEXT_ROW_HEADER;
              damage_zone(current_row, current_col, select_row, select_col);
              ret = 1;
            }
          }
          break;
          
        default:
          ret = 0;		// express disinterest
          break;
      }
      _last_row = R;
      break;
      
    case FL_DRAG:
      if (_auto_drag == 1) {
        ret = 1;
        break;
      } 
      if ( _resizing_col > -1 ) {
        // Dragging column?
        //
        //    Let user drag even /outside/ the row/col widget.
        //    Don't allow column width smaller than 1.
        //    Continue to show FL_CURSOR_WE at all times during drag.
        //
        int offset = _dragging_x - _event_x;
        int new_w = col_width(_resizing_col) - offset;
        if ( new_w < _col_resize_min ) new_w = _col_resize_min;
        col_width(_resizing_col, new_w);
        _dragging_x = _event_x;
        table_resized();
        redraw();
        change_cursor(FL_CURSOR_WE);
        ret = 1;
        if ( Fl_Widget::callback() && when() & FL_WHEN_CHANGED ) {
          do_callback(CONTEXT_RC_RESIZE, R, C);
        }
      }
      else if ( _resizing_row > -1 ) {
        // Dragging row?
        //
        //    Let user drag even /outside/ the row/col widget.
        //    Don't allow row width smaller than 1.
        //    Continue to show FL_CURSOR_NS at all times during drag.
        //
        int offset = _dragging_y - _event_y;
        int new_h = row_height(_resizing_row) - offset;
        if ( new_h < _row_resize_min ) new_h = _row_resize_min;
        row_height(_resizing_row, new_h);
        _dragging_y = _event_y;
        table_resized();
        redraw();
        change_cursor(FL_CURSOR_NS);
        ret = 1;
        if ( Fl_Widget::callback() && when() & FL_WHEN_CHANGED ) {
          do_callback(CONTEXT_RC_RESIZE, R, C);
        }
      } else {
        if (_event_button == 1 && 
            _selecting == CONTEXT_CELL &&
            context == CONTEXT_CELL) {
          // Dragging a cell selection?
	  if ( _event_clicks ) break;			// STR #3018 - item 2
          if (select_row != R || select_col != C) {
            damage_zone(current_row, current_col, select_row, select_col, R, C);
          }
          select_row = R;
          select_col = C;
          ret = 1;
        }
        else if (_event_button == 1 && 
                 _selecting == CONTEXT_ROW_HEADER && 
                 context & (CONTEXT_ROW_HEADER|CONTEXT_COL_HEADER|CONTEXT_CELL)) {
          if (select_row != R) {
            damage_zone(current_row, current_col, select_row, select_col, R, C);
          }
          select_row = R;
          ret = 1;
        }
        else if (_event_button == 1 && 
                 _selecting == CONTEXT_COL_HEADER 
                 && context & (CONTEXT_ROW_HEADER|CONTEXT_COL_HEADER|CONTEXT_CELL)) {
          if (select_col != C) {
            damage_zone(current_row, current_col, select_row, select_col, R, C);
          }
          select_col = C;
          ret = 1;
        }
      }
      // Enable autodrag if not resizing, and mouse has moved off table edge
      if ( _resizing_row < 0 && _resizing_col < 0 && _auto_drag == 0 && 
          ( _event_x > x() + w() - 20 ||
            _event_x < x() + row_header_width() || 
            _event_y > y() + h() - 20 ||
            _event_y < y() + col_header_height()
           ) ) {
            _start_auto_drag();
          }
      break;
      
    case FL_RELEASE:
      _stop_auto_drag();
      switch ( context ) {
        case CONTEXT_ROW_HEADER:		// release on row header
        case CONTEXT_COL_HEADER:		// release on col header
        case CONTEXT_CELL:			// release on a cell
        case CONTEXT_TABLE:			// release on dead zone
          if ( _resizing_col == -1 &&		// not resizing a column
              _resizing_row == -1 &&		// not resizing a row
              Fl_Widget::callback() && 		// callback defined
              when() & FL_WHEN_RELEASE && 	// on button release
              _last_row == R ) {		// release on same row PUSHed?
            // Need this for eg. left clicking on a cell to select it
            do_callback(context, R, C);
          }
          break;
          
        default:
          break;
      }
      if ( _event_button == 1 ) {
        change_cursor(FL_CURSOR_DEFAULT);
        _resizing_col = -1;
        _resizing_row = -1;
        ret = 1;
      }
      break;
      
    case FL_MOVE:
      if ( context == CONTEXT_COL_HEADER && 		// in column header?
          resizeflag ) {				// resize + near boundary?
        change_cursor(FL_CURSOR_WE);			// show resize cursor
      }
      else if ( context == CONTEXT_ROW_HEADER && 	// in row header?
               resizeflag ) {				// resize + near boundary?
        change_cursor(FL_CURSOR_NS);			// show resize cursor
      } else {
        change_cursor(FL_CURSOR_DEFAULT);		// normal cursor
      }
      ret = 1;
      break;
      
    case FL_ENTER:		// See FLTK event docs on the FL_ENTER widget
      if (!ret) take_focus();
      ret = 1;
      //FALLTHROUGH
      
    case FL_LEAVE:		// We want to track the mouse if resizing is allowed.
      if ( resizeflag ) {
        ret = 1;
      }
      if ( event == FL_LEAVE ) {
        _stop_auto_drag();
        change_cursor(FL_CURSOR_DEFAULT);
      }
      break;
      
    case FL_FOCUS:
      Fl::focus(this);
      //FALLTHROUGH
      
    case FL_UNFOCUS:
      _stop_auto_drag();
      ret = 1;
      break;
      
    case FL_KEYBOARD: {
      ret = 0;
      int is_row = select_row;
      int is_col = select_col;
      switch(_event_key) {
        case FL_Home:
          ret = move_cursor(0, -1000000);
          break;
        case FL_End:
          ret = move_cursor(0, 1000000);
          break;
        case FL_Page_Up:
          ret = move_cursor(-(botrow - toprow - 1), 0);
          break;
        case FL_Page_Down:
          ret = move_cursor(botrow - toprow - 1 , 0);
          break;
        case FL_Left:
          ret = move_cursor(0, -1);
          break;
        case FL_Right:
          ret = move_cursor(0, 1);
          break;
        case FL_Up:
          ret = move_cursor(-1, 0);
          break;
        case FL_Down:
          ret = move_cursor(1, 0);
          break;
	case FL_Tab:
#if FLTK_ABI_VERSION >= 10303
	  if ( !tab_cell_nav() ) break;		// not navigating cells? let fltk handle it (STR#2862)
	  if ( _event_state & FL_SHIFT ) {
            ret = move_cursor(0, -1, 0);	// shift-tab -> left
	  } else {
	    ret = move_cursor(0, 1, 0);		// tab -> right
	  }
          break;
#else
          break;				// without tab_cell_nav(), Fl_Table should default to navigating widgets, not cells
#endif
      }
      if (ret && Fl::focus() != this) {
        do_callback(CONTEXT_TABLE, -1, -1);
        take_focus();
      }
      //if (!ret && Fl_Widget::callback() && when() & FL_WHEN_NOT_CHANGED  )
      if ( Fl_Widget::callback() && 
          (
           ( !ret && when() & FL_WHEN_NOT_CHANGED ) || 
           ( is_row!= select_row || is_col!= select_col ) 
           )
          ) {
        do_callback(CONTEXT_CELL, select_row, select_col); 
        //damage_zone(current_row, current_col, select_row, select_col);
        ret = 1;
      }
      break;
    }
      
    default:
      change_cursor(FL_CURSOR_DEFAULT);
      break;
  }
  return(ret);
}